

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pscp.c
# Opt level: O0

int scp_get_sink_action(scp_sink_action *act)

{
  strbuf *psVar1;
  FILE *pFVar2;
  scp_sftp_dirstack *psVar3;
  _Bool _Var4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  char *local_120;
  int local_104;
  char *pcStack_100;
  int i_1;
  char *san_6;
  char *san_5;
  int local_e8;
  char ch;
  int action;
  _Bool done;
  char *san_4;
  char *san_3;
  char *pcStack_c8;
  int i;
  char *san_2;
  char *san_1;
  fxp_names *names;
  fxp_name *ournames;
  size_t namesize;
  size_t nnames;
  fxp_handle *dirhandle;
  scp_sftp_dirstack *newitem;
  char *san;
  scp_sftp_dirstack *head;
  sftp_request *psStack_70;
  _Bool ret;
  sftp_request *req;
  sftp_packet *pktin;
  fxp_attrs attrs;
  char *pcStack_20;
  _Bool must_free_fname;
  char *fname;
  scp_sink_action *act_local;
  
  if (using_sftp) {
    if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) {
      if (scp_sftp_donethistarget) {
        return 1;
      }
      pcStack_20 = scp_sftp_remotepath;
      attrs.mtime._7_1_ = 0;
      scp_sftp_donethistarget = true;
    }
    else {
      san = (char *)scp_sftp_dirstack_head;
      while( true ) {
        bVar9 = false;
        if (*(int *)(san + 0x10) < *(int *)(san + 0x14)) {
          _Var4 = is_dots(*(char **)(*(long *)(san + 8) + (long)*(int *)(san + 0x10) * 0x48));
          bVar9 = true;
          if ((!_Var4) && (bVar9 = false, *(long *)(san + 0x20) != 0)) {
            iVar5 = wc_match(*(char **)(san + 0x20),
                             *(char **)(*(long *)(san + 8) + (long)*(int *)(san + 0x10) * 0x48));
            bVar9 = iVar5 == 0;
          }
        }
        if (!bVar9) break;
        *(int *)(san + 0x10) = *(int *)(san + 0x10) + 1;
      }
      if (*(int *)(san + 0x14) <= *(int *)(san + 0x10)) {
        if (*(long *)(san + 0x20) == 0) {
          act->action = 3;
        }
        else {
          act->action = 4;
          if ((san[0x28] & 1U) == 0) {
            tell_user(_stderr,"pscp: wildcard \'%s\' matched no files",*(undefined8 *)(san + 0x20));
            errs = errs + 1;
          }
          safefree(*(void **)(san + 0x20));
        }
        safefree(*(void **)(san + 0x18));
        safefree(*(void **)(san + 8));
        scp_sftp_dirstack_head = *(scp_sftp_dirstack **)san;
        safefree(san);
        return 0;
      }
      san[0x28] = '\x01';
      iVar5 = *(int *)(san + 0x10);
      *(int *)(san + 0x10) = iVar5 + 1;
      pcStack_20 = dupcat_fn(*(char **)(san + 0x18),"/",
                             *(undefined8 *)(*(long *)(san + 8) + (long)iVar5 * 0x48),0);
      attrs.mtime._7_1_ = 1;
    }
    psStack_70 = fxp_stat_send(pcStack_20);
    req = (sftp_request *)sftp_wait_for_reply(psStack_70);
    head._7_1_ = fxp_stat_recv((sftp_packet *)req,psStack_70,(fxp_attrs *)&pktin);
    if (((bool)head._7_1_) && (((ulong)pktin & 4) != 0)) {
      if ((attrs.gid & 0x4000) == 0) {
        act->action = 1;
        strbuf_clear(act->buf);
        psVar1 = act->buf;
        pcVar8 = stripslashes(pcStack_20,false);
        BinarySink_put_asciz(psVar1->binarysink_,pcVar8);
        act->name = act->buf->s;
        if (((ulong)pktin & 1) == 0) {
          act->size = 0xffffffffffffffff;
        }
        else {
          act->size = attrs.flags;
        }
        act->permissions = attrs.gid & 0xfff;
        if (((scp_sftp_preserve & 1U) == 0) || (((ulong)pktin & 8) == 0)) {
          act->settime = false;
        }
        else {
          act->atime = attrs.permissions;
          act->mtime = attrs.atime;
          act->settime = true;
        }
        if ((attrs.mtime._7_1_ & 1) == 0) {
          scp_sftp_currentname = dupstr(pcStack_20);
        }
        else {
          scp_sftp_currentname = pcStack_20;
        }
        act_local._4_4_ = 0;
      }
      else if (((scp_sftp_recursive & 1U) == 0) && (scp_sftp_wildcard == (char *)0x0)) {
        san_2 = stripctrl_string(string_scc,pcStack_20);
        while (san_2 != (char *)0x0) {
          tell_user(_stderr,"pscp: %s: is a directory",san_2);
          safefree(san_2);
          san_2 = (char *)0x0;
        }
        errs = errs + 1;
        if ((attrs.mtime._7_1_ & 1) != 0) {
          safefree(pcStack_20);
        }
        if (scp_sftp_dirstack_head == (scp_sftp_dirstack *)0x0) {
          act_local._4_4_ = 1;
        }
        else {
          act->action = 4;
          act_local._4_4_ = 0;
        }
      }
      else {
        psStack_70 = fxp_opendir_send(pcStack_20);
        req = (sftp_request *)sftp_wait_for_reply(psStack_70);
        nnames = (size_t)fxp_opendir_recv((sftp_packet *)req,psStack_70);
        if ((fxp_handle *)nnames == (fxp_handle *)0x0) {
          pcStack_c8 = stripctrl_string(string_scc,pcStack_20);
          while (pcVar8 = pcStack_c8, pFVar2 = _stderr, pcStack_c8 != (char *)0x0) {
            pcVar6 = fxp_error();
            tell_user(pFVar2,"pscp: unable to open directory %s: %s",pcVar8,pcVar6);
            safefree(pcStack_c8);
            pcStack_c8 = (char *)0x0;
          }
          if ((attrs.mtime._7_1_ & 1) != 0) {
            safefree(pcStack_20);
          }
          errs = errs + 1;
          act_local._4_4_ = 1;
        }
        else {
          ournames = (fxp_name *)0x0;
          namesize = 0;
          names = (fxp_names *)0x0;
          while( true ) {
            psStack_70 = fxp_readdir_send((fxp_handle *)nnames);
            req = (sftp_request *)sftp_wait_for_reply(psStack_70);
            san_1 = (char *)fxp_readdir_recv((sftp_packet *)req,psStack_70);
            if ((fxp_names *)san_1 == (fxp_names *)0x0) break;
            if (((fxp_names *)san_1)->nnames == 0) {
              fxp_free_names((fxp_names *)san_1);
              goto LAB_00110718;
            }
            names = (fxp_names *)
                    safegrowarray(names,(size_t *)&ournames,0x48,namesize,
                                  (long)((fxp_names *)san_1)->nnames,false);
            for (san_3._4_4_ = 0; san_3._4_4_ < *(int *)san_1; san_3._4_4_ = san_3._4_4_ + 1) {
              iVar5 = strcmp(*(char **)(*(long *)(san_1 + 8) + (long)san_3._4_4_ * 0x48),".");
              if ((iVar5 != 0) &&
                 (iVar5 = strcmp(*(char **)(*(long *)(san_1 + 8) + (long)san_3._4_4_ * 0x48),".."),
                 iVar5 != 0)) {
                _Var4 = vet_filename(*(char **)(*(long *)(san_1 + 8) + (long)san_3._4_4_ * 0x48));
                if (_Var4) {
                  lVar7 = namesize * 0x48;
                  namesize = namesize + 1;
                  memcpy((void *)((long)names + lVar7),
                         (void *)(*(long *)(san_1 + 8) + (long)san_3._4_4_ * 0x48),0x48);
                }
                else {
                  _action = stripctrl_string(string_scc,
                                             *(char **)(*(long *)(san_1 + 8) +
                                                       (long)san_3._4_4_ * 0x48));
                  while (_action != (char *)0x0) {
                    tell_user(_stderr,
                              "ignoring potentially dangerous server-supplied filename \'%s\'",
                              _action);
                    safefree(_action);
                    _action = (char *)0x0;
                  }
                }
              }
            }
            san_1[0] = '\0';
            san_1[1] = '\0';
            san_1[2] = '\0';
            san_1[3] = '\0';
            fxp_free_names((fxp_names *)san_1);
          }
          iVar5 = fxp_error_type();
          if (iVar5 == 1) {
LAB_00110718:
            psStack_70 = fxp_close_send((fxp_handle *)nnames);
            req = (sftp_request *)sftp_wait_for_reply(psStack_70);
            fxp_close_recv((sftp_packet *)req,psStack_70);
            dirhandle = (fxp_handle *)safemalloc(1,0x30,0);
            dirhandle->hstring = (char *)scp_sftp_dirstack_head;
            *(fxp_names **)&dirhandle->hlen = names;
            *(undefined4 *)&dirhandle[1].hstring = 0;
            *(int *)((long)&dirhandle[1].hstring + 4) = (int)namesize;
            if ((attrs.mtime._7_1_ & 1) == 0) {
              pcVar8 = dupstr(pcStack_20);
              *(char **)&dirhandle[1].hlen = pcVar8;
            }
            else {
              *(char **)&dirhandle[1].hlen = pcStack_20;
            }
            if (scp_sftp_wildcard == (char *)0x0) {
              dirhandle[2].hstring = (char *)0x0;
            }
            else {
              dirhandle[2].hstring = scp_sftp_wildcard;
              *(undefined1 *)&dirhandle[2].hlen = 0;
              scp_sftp_wildcard = (char *)0x0;
            }
            scp_sftp_dirstack_head = (scp_sftp_dirstack *)dirhandle;
            if (dirhandle[2].hstring == (char *)0x0) {
              act->action = 2;
              strbuf_clear(act->buf);
              psVar1 = act->buf;
              pcVar8 = stripslashes(pcStack_20,false);
              BinarySink_put_asciz(psVar1->binarysink_,pcVar8);
              act->name = act->buf->s;
              act->size = 0;
              act->permissions = attrs.gid & 0xfff;
              if (((scp_sftp_preserve & 1U) == 0) || (((ulong)pktin & 8) == 0)) {
                act->settime = false;
              }
              else {
                act->atime = attrs.permissions;
                act->mtime = attrs.atime;
                act->settime = true;
              }
            }
            else {
              act->action = 4;
            }
            act_local._4_4_ = 0;
          }
          else {
            san_4 = stripctrl_string(string_scc,pcStack_20);
            while (pcVar8 = san_4, pFVar2 = _stderr, san_4 != (char *)0x0) {
              pcVar6 = fxp_error();
              tell_user(pFVar2,"pscp: reading directory %s: %s",pcVar8,pcVar6);
              safefree(san_4);
              san_4 = (char *)0x0;
            }
            psStack_70 = fxp_close_send((fxp_handle *)nnames);
            req = (sftp_request *)sftp_wait_for_reply(psStack_70);
            fxp_close_recv((sftp_packet *)req,psStack_70);
            if ((attrs.mtime._7_1_ & 1) != 0) {
              safefree(pcStack_20);
            }
            safefree(names);
            errs = errs + 1;
            act_local._4_4_ = 1;
          }
        }
      }
    }
    else {
      newitem = (scp_sftp_dirstack *)stripctrl_string(string_scc,pcStack_20);
      while (psVar3 = newitem, pFVar2 = _stderr, newitem != (scp_sftp_dirstack *)0x0) {
        if ((head._7_1_ & 1) == 0) {
          local_120 = fxp_error();
        }
        else {
          local_120 = "file type not supplied";
        }
        tell_user(pFVar2,"unable to identify %s: %s",psVar3,local_120);
        safefree(newitem);
        newitem = (scp_sftp_dirstack *)0x0;
      }
      if ((attrs.mtime._7_1_ & 1) != 0) {
        safefree(pcStack_20);
      }
      errs = errs + 1;
      act_local._4_4_ = 1;
    }
  }
  else {
    ch = '\0';
    act->settime = false;
    strbuf_clear(act->buf);
    while (((ch ^ 0xffU) & 1) != 0) {
      _Var4 = ssh_scp_recv((void *)((long)&san_5 + 7),1);
      if (!_Var4) {
        return 1;
      }
      if (san_5._7_1_ == '\n') {
        bump("Protocol error: Unexpected newline");
      }
      local_e8 = (int)(char)san_5._7_1_;
      while( true ) {
        _Var4 = ssh_scp_recv((void *)((long)&san_5 + 7),1);
        if (!_Var4) {
          bump("Lost connection");
        }
        if (san_5._7_1_ == '\n') break;
        BinarySink_put_byte(act->buf->binarysink_,san_5._7_1_);
      }
      if (local_e8 == 1) {
        san_6 = stripctrl_string(string_scc,act->buf->s);
        while (san_6 != (char *)0x0) {
          tell_user(_stderr,"%s",san_6);
          safefree(san_6);
          san_6 = (char *)0x0;
        }
        errs = errs + 1;
      }
      else {
        if (local_e8 == 2) {
          pcStack_100 = stripctrl_string(string_scc,act->buf->s);
          if (pcStack_100 != (char *)0x0) {
            bump("%s",pcStack_100);
          }
          pcStack_100 = (char *)0x0;
LAB_00110bd3:
          backend_send(backend,anon_var_dwarf_23ee3 + 10,1);
          act->action = 3;
          return 0;
        }
        if (local_e8 - 0x43U < 2) {
          iVar5 = 2;
          if (local_e8 == 0x43) {
            iVar5 = 1;
          }
          act->action = iVar5;
          if ((act->action == 2) && ((recursive & 1U) == 0)) {
            bump(
                "security violation: remote host attempted to create a subdirectory in a non-recursive copy!"
                );
          }
          ch = '\x01';
        }
        else {
          if (local_e8 == 0x45) goto LAB_00110bd3;
          if (local_e8 != 0x54) {
            bump("Protocol error: Expected control record");
          }
          iVar5 = __isoc99_sscanf(act->buf->s,"%lu %*d %lu %*d",&act->mtime,&act->atime);
          if (iVar5 != 2) {
            bump("Protocol error: Illegal time format");
          }
          act->settime = true;
          backend_send(backend,anon_var_dwarf_23ee3 + 10,1);
          strbuf_clear(act->buf);
        }
      }
    }
    iVar5 = __isoc99_sscanf(act->buf->s,"%lo %lu %n",&act->permissions,&act->size,&local_104);
    if (iVar5 != 2) {
      bump("Protocol error: Illegal file descriptor format");
    }
    act->name = act->buf->s + local_104;
    act_local._4_4_ = 0;
  }
  return act_local._4_4_;
}

Assistant:

int scp_get_sink_action(struct scp_sink_action *act)
{
    if (using_sftp) {
        char *fname;
        bool must_free_fname;
        struct fxp_attrs attrs;
        struct sftp_packet *pktin;
        struct sftp_request *req;
        bool ret;

        if (!scp_sftp_dirstack_head) {
            if (!scp_sftp_donethistarget) {
                /*
                 * Simple case: we are only dealing with one file.
                 */
                fname = scp_sftp_remotepath;
                must_free_fname = false;
                scp_sftp_donethistarget = true;
            } else {
                /*
                 * Even simpler case: one file _which we've done_.
                 * Return 1 (finished).
                 */
                return 1;
            }
        } else {
            /*
             * We're now in the middle of stepping through a list
             * of names returned from fxp_readdir(); so let's carry
             * on.
             */
            struct scp_sftp_dirstack *head = scp_sftp_dirstack_head;
            while (head->namepos < head->namelen &&
                   (is_dots(head->names[head->namepos].filename) ||
                    (head->wildcard &&
                     !wc_match(head->wildcard,
                               head->names[head->namepos].filename))))
                head->namepos++;       /* skip . and .. */
            if (head->namepos < head->namelen) {
                head->matched_something = true;
                fname = dupcat(head->dirpath, "/",
                               head->names[head->namepos++].filename);
                must_free_fname = true;
            } else {
                /*
                 * We've come to the end of the list; pop it off
                 * the stack and return an ENDDIR action (or RETRY
                 * if this was a wildcard match).
                 */
                if (head->wildcard) {
                    act->action = SCP_SINK_RETRY;
                    if (!head->matched_something) {
                        tell_user(stderr, "pscp: wildcard '%s' matched "
                                  "no files", head->wildcard);
                        errs++;
                    }
                    sfree(head->wildcard);

                } else {
                    act->action = SCP_SINK_ENDDIR;
                }

                sfree(head->dirpath);
                sfree(head->names);
                scp_sftp_dirstack_head = head->next;
                sfree(head);

                return 0;
            }
        }

        /*
         * Now we have a filename. Stat it, and see if it's a file
         * or a directory.
         */
        req = fxp_stat_send(fname);
        pktin = sftp_wait_for_reply(req);
        ret = fxp_stat_recv(pktin, req, &attrs);

        if (!ret || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
            with_stripctrl(san, fname)
                tell_user(stderr, "unable to identify %s: %s", san,
                          ret ? "file type not supplied" : fxp_error());
            if (must_free_fname) sfree(fname);
            errs++;
            return 1;
        }

        if (attrs.permissions & 0040000) {
            struct scp_sftp_dirstack *newitem;
            struct fxp_handle *dirhandle;
            size_t nnames, namesize;
            struct fxp_name *ournames;
            struct fxp_names *names;

            /*
             * It's a directory. If we're not in recursive mode,
             * this merits a complaint (which is fatal if the name
             * was specified directly, but not if it was matched by
             * a wildcard).
             *
             * We skip this complaint completely if
             * scp_sftp_wildcard is set, because that's an
             * indication that we're not actually supposed to
             * _recursively_ transfer the dir, just scan it for
             * things matching the wildcard.
             */
            if (!scp_sftp_recursive && !scp_sftp_wildcard) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: %s: is a directory", san);
                errs++;
                if (must_free_fname) sfree(fname);
                if (scp_sftp_dirstack_head) {
                    act->action = SCP_SINK_RETRY;
                    return 0;
                } else {
                    return 1;
                }
            }

            /*
             * Otherwise, the fun begins. We must fxp_opendir() the
             * directory, slurp the filenames into memory, return
             * SCP_SINK_DIR (unless this is a wildcard match), and
             * set targetisdir. The next time we're called, we will
             * run through the list of filenames one by one,
             * matching them against a wildcard if present.
             *
             * If targetisdir is _already_ set (meaning we're
             * already in the middle of going through another such
             * list), we must push the other (target,namelist) pair
             * on a stack.
             */
            req = fxp_opendir_send(fname);
            pktin = sftp_wait_for_reply(req);
            dirhandle = fxp_opendir_recv(pktin, req);

            if (!dirhandle) {
                with_stripctrl(san, fname)
                    tell_user(stderr, "pscp: unable to open directory %s: %s",
                              san, fxp_error());
                if (must_free_fname) sfree(fname);
                errs++;
                return 1;
            }
            nnames = namesize = 0;
            ournames = NULL;
            while (1) {
                int i;

                req = fxp_readdir_send(dirhandle);
                pktin = sftp_wait_for_reply(req);
                names = fxp_readdir_recv(pktin, req);

                if (names == NULL) {
                    if (fxp_error_type() == SSH_FX_EOF)
                        break;
                    with_stripctrl(san, fname)
                        tell_user(stderr, "pscp: reading directory %s: %s",
                                  san, fxp_error());

                    req = fxp_close_send(dirhandle);
                    pktin = sftp_wait_for_reply(req);
                    fxp_close_recv(pktin, req);

                    if (must_free_fname) sfree(fname);
                    sfree(ournames);
                    errs++;
                    return 1;
                }
                if (names->nnames == 0) {
                    fxp_free_names(names);
                    break;
                }
                sgrowarrayn(ournames, namesize, nnames, names->nnames);
                for (i = 0; i < names->nnames; i++) {
                    if (!strcmp(names->names[i].filename, ".") ||
                        !strcmp(names->names[i].filename, "..")) {
                        /*
                         * . and .. are normal consequences of
                         * reading a directory, and aren't worth
                         * complaining about.
                         */
                    } else if (!vet_filename(names->names[i].filename)) {
                        with_stripctrl(san, names->names[i].filename)
                            tell_user(stderr, "ignoring potentially dangerous "
                                      "server-supplied filename '%s'", san);
                    } else
                        ournames[nnames++] = names->names[i];
                }
                names->nnames = 0;             /* prevent free_names */
                fxp_free_names(names);
            }
            req = fxp_close_send(dirhandle);
            pktin = sftp_wait_for_reply(req);
            fxp_close_recv(pktin, req);

            newitem = snew(struct scp_sftp_dirstack);
            newitem->next = scp_sftp_dirstack_head;
            newitem->names = ournames;
            newitem->namepos = 0;
            newitem->namelen = nnames;
            if (must_free_fname)
                newitem->dirpath = fname;
            else
                newitem->dirpath = dupstr(fname);
            if (scp_sftp_wildcard) {
                newitem->wildcard = scp_sftp_wildcard;
                newitem->matched_something = false;
                scp_sftp_wildcard = NULL;
            } else {
                newitem->wildcard = NULL;
            }
            scp_sftp_dirstack_head = newitem;

            if (newitem->wildcard) {
                act->action = SCP_SINK_RETRY;
            } else {
                act->action = SCP_SINK_DIR;
                strbuf_clear(act->buf);
                put_asciz(act->buf, stripslashes(fname, false));
                act->name = act->buf->s;
                act->size = 0;     /* duhh, it's a directory */
                act->permissions = 07777 & attrs.permissions;
                if (scp_sftp_preserve &&
                    (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                    act->atime = attrs.atime;
                    act->mtime = attrs.mtime;
                    act->settime = true;
                } else
                    act->settime = false;
            }
            return 0;

        } else {
            /*
             * It's a file. Return SCP_SINK_FILE.
             */
            act->action = SCP_SINK_FILE;
            strbuf_clear(act->buf);
            put_asciz(act->buf, stripslashes(fname, false));
            act->name = act->buf->s;
            if (attrs.flags & SSH_FILEXFER_ATTR_SIZE) {
                act->size = attrs.size;
            } else
                act->size = UINT64_MAX;   /* no idea */
            act->permissions = 07777 & attrs.permissions;
            if (scp_sftp_preserve &&
                (attrs.flags & SSH_FILEXFER_ATTR_ACMODTIME)) {
                act->atime = attrs.atime;
                act->mtime = attrs.mtime;
                act->settime = true;
            } else
                act->settime = false;
            if (must_free_fname)
                scp_sftp_currentname = fname;
            else
                scp_sftp_currentname = dupstr(fname);
            return 0;
        }

    } else {
        bool done = false;
        int action;
        char ch;

        act->settime = false;
        strbuf_clear(act->buf);

        while (!done) {
            if (!ssh_scp_recv(&ch, 1))
                return 1;
            if (ch == '\n')
                bump("Protocol error: Unexpected newline");
            action = ch;
            while (1) {
                if (!ssh_scp_recv(&ch, 1))
                    bump("Lost connection");
                if (ch == '\n')
                    break;
                put_byte(act->buf, ch);
            }
            switch (action) {
              case '\01':                      /* error */
                with_stripctrl(san, act->buf->s)
                    tell_user(stderr, "%s", san);
                errs++;
                continue;                      /* go round again */
              case '\02':                      /* fatal error */
                with_stripctrl(san, act->buf->s)
                    bump("%s", san);
              case 'E':
                backend_send(backend, "", 1);
                act->action = SCP_SINK_ENDDIR;
                return 0;
              case 'T':
                if (sscanf(act->buf->s, "%lu %*d %lu %*d",
                           &act->mtime, &act->atime) == 2) {
                    act->settime = true;
                    backend_send(backend, "", 1);
                    strbuf_clear(act->buf);
                    continue;          /* go round again */
                }
                bump("Protocol error: Illegal time format");
              case 'C':
              case 'D':
                act->action = (action == 'C' ? SCP_SINK_FILE : SCP_SINK_DIR);
                if (act->action == SCP_SINK_DIR && !recursive) {
                    bump("security violation: remote host attempted to create "
                         "a subdirectory in a non-recursive copy!");
                }
                break;
              default:
                bump("Protocol error: Expected control record");
            }
            /*
             * We will go round this loop only once, unless we hit
             * `continue' above.
             */
            done = true;
        }

        /*
         * If we get here, we must have seen SCP_SINK_FILE or
         * SCP_SINK_DIR.
         */
        {
            int i;
            if (sscanf(act->buf->s, "%lo %"SCNu64" %n", &act->permissions,
                       &act->size, &i) != 2)
                bump("Protocol error: Illegal file descriptor format");
            act->name = act->buf->s + i;
            return 0;
        }
    }
}